

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::
on<baryonyx::raw_problem>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this,
          assertion<baryonyx::raw_problem> *assertion)

{
  bool bVar1;
  assertion_fail<baryonyx::raw_problem> local_1e0;
  assertion_pass<baryonyx::raw_problem> local_f8;
  assertion<baryonyx::raw_problem> *local_20;
  assertion<baryonyx::raw_problem> *assertion_local;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this_local;
  
  if ((this->dry_run_ & 1U) == 0) {
    local_20 = assertion;
    assertion_local = (assertion<baryonyx::raw_problem> *)this;
    bVar1 = baryonyx::raw_problem::operator_cast_to_bool(&assertion->expr);
    if (bVar1) {
      baryonyx::raw_problem::raw_problem(&local_f8.expr,&assertion->expr);
      local_f8.location.line_ = (assertion->location).line_;
      local_f8.location.file_ = (assertion->location).file_;
      reporter<boost::ext::ut::v1_1_8::printer>::on<baryonyx::raw_problem>
                (&this->reporter_,&local_f8);
      events::assertion_pass<baryonyx::raw_problem>::~assertion_pass(&local_f8);
      this_local._7_1_ = true;
    }
    else {
      this->fails_ = this->fails_ + 1;
      baryonyx::raw_problem::raw_problem(&local_1e0.expr,&assertion->expr);
      local_1e0.location.line_ = (assertion->location).line_;
      local_1e0.location.file_ = (assertion->location).file_;
      reporter<boost::ext::ut::v1_1_8::printer>::on<baryonyx::raw_problem>
                (&this->reporter_,&local_1e0);
      events::assertion_fail<baryonyx::raw_problem>::~assertion_fail(&local_1e0);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }